

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlParser.cpp
# Opt level: O0

void __thiscall KDReports::Test::testMargins(Test *this)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  double local_100;
  qreal local_f8;
  double local_f0;
  double local_e8;
  double local_e0;
  qreal local_d8;
  double local_d0;
  qreal local_c8;
  double local_c0;
  qreal right;
  qreal bottom;
  qreal left;
  qreal top;
  QString local_88;
  undefined8 local_70;
  QTextDocument *doc;
  Report report;
  QFlags<QIODeviceBase::OpenModeFlag> local_48 [4];
  QString local_38;
  QFile local_20 [8];
  QFile file;
  Test *this_local;
  
  QString::QString(&local_38,":/margins.xml");
  QFile::QFile(local_20,(QString *)&local_38);
  QString::~QString(&local_38);
  QFlags<QIODeviceBase::OpenModeFlag>::QFlags(local_48,ReadOnly);
  bVar1 = QFile::open((QFlags_conflict *)local_20);
  bVar1 = QTest::qVerify((bool)(bVar1 & 1),"file.open(QIODevice::ReadOnly)","",
                         "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                         ,0x58);
  if ((bVar1 & 1) != 0) {
    KDReports::Report::Report((Report *)&doc,(QObject *)0x0);
    bVar1 = KDReports::Report::loadFromXML((QIODevice *)&doc,(ErrorDetails *)local_20);
    bVar1 = QTest::qVerify((bool)(bVar1 & 1),"report.loadFromXML(&file)","",
                           "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                           ,0x5a);
    if ((bVar1 & 1) != 0) {
      local_70 = KDReports::Report::mainTextDocument();
      iVar3 = QTextDocument::blockCount();
      bVar1 = QTest::qCompare(iVar3,2,"doc.blockCount()","2",
                              "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                              ,0x5c);
      if ((bVar1 & 1) != 0) {
        QTextDocument::toPlainText();
        QString::QString((QString *)&top,"Title\nTest used by XmlParser.cpp");
        bVar2 = QTest::qCompare(&local_88,(QString *)&top,"doc.toPlainText()",
                                "QString(\"Title\\nTest used by XmlParser.cpp\")",
                                "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                                ,0x5d);
        QString::~QString((QString *)&top);
        QString::~QString(&local_88);
        if (((bVar2 ^ 0xffU) & 1) == 0) {
          KDReports::Report::getMargins((double *)&doc,&left,&bottom,&right);
          local_c8 = left;
          local_d0 = 40.0;
          bVar1 = QTest::qCompare(&local_c8,&local_d0,"static_cast<double>(top)","40.0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                                  ,99);
          if (((bVar1 ^ 0xff) & 1) == 0) {
            local_d8 = bottom;
            local_e0 = 0.0;
            bVar1 = QTest::qCompare(&local_d8,&local_e0,"static_cast<double>(left)","0.0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                                    ,100);
            if (((bVar1 ^ 0xff) & 1) == 0) {
              local_e8 = local_c0;
              local_f0 = 20.0;
              bVar1 = QTest::qCompare(&local_e8,&local_f0,"static_cast<double>(right)","20.0",
                                      "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                                      ,0x65);
              if (((bVar1 ^ 0xff) & 1) == 0) {
                local_f8 = right;
                local_100 = 20.0;
                QTest::qCompare(&local_f8,&local_100,"static_cast<double>(bottom)","20.0",
                                "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                                ,0x66);
              }
            }
          }
        }
      }
    }
    KDReports::Report::~Report((Report *)&doc);
  }
  QFile::~QFile(local_20);
  return;
}

Assistant:

void testMargins()
    {
        QFile file(":/margins.xml");
        QVERIFY(file.open(QIODevice::ReadOnly));
        Report report;
        QVERIFY(report.loadFromXML(&file));
        const QTextDocument &doc = *report.mainTextDocument();
        QCOMPARE(doc.blockCount(), 2);
        QCOMPARE(doc.toPlainText(), QString("Title\nTest used by XmlParser.cpp"));
        qreal top;
        qreal left;
        qreal bottom;
        qreal right;
        report.getMargins(&top, &left, &bottom, &right);
        QCOMPARE(static_cast<double>(top), 40.0);
        QCOMPARE(static_cast<double>(left), 0.0);
        QCOMPARE(static_cast<double>(right), 20.0);
        QCOMPARE(static_cast<double>(bottom), 20.0);
    }